

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsub.c
# Opt level: O2

int nn_xsub_create(void *hint,nn_sockbase **sockbase)

{
  nn_sockbase *self;
  
  self = (nn_sockbase *)nn_alloc_(0x1a0);
  if (self != (nn_sockbase *)0x0) {
    nn_sockbase_init(self,&nn_xsub_sockbase_vfptr,hint);
    nn_fq_init((nn_fq *)(self + 1));
    nn_trie_init((nn_trie *)&self[0x19].sock);
    *sockbase = self;
    return 0;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/pubsub/xsub.c"
          ,0xdb);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

int nn_xsub_create (void *hint, struct nn_sockbase **sockbase)
{
    struct nn_xsub *self;

    self = nn_alloc (sizeof (struct nn_xsub), "socket (xsub)");
    alloc_assert (self);
    nn_xsub_init (self, &nn_xsub_sockbase_vfptr, hint);
    *sockbase = &self->sockbase;

    return 0;
}